

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

int __thiscall ncnn::Interp::load_param(Interp *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->resize_type = iVar1;
  fVar2 = ParamDict::get(pd,1,1.0);
  this->height_scale = fVar2;
  fVar2 = ParamDict::get(pd,2,1.0);
  this->width_scale = fVar2;
  iVar1 = ParamDict::get(pd,3,0);
  this->output_height = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->output_width = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->dynamic_target_size = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->align_corner = iVar1;
  if ((uint)this->resize_type < 4) {
    iVar1 = 0;
    if (this->dynamic_target_size == 1) {
      (this->super_Layer).one_blob_only = false;
      iVar1 = 0;
    }
  }
  else {
    load_param((Interp *)(ulong)(uint)this->resize_type);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Interp::load_param(const ParamDict& pd)
{
    resize_type = pd.get(0, 0);
    height_scale = pd.get(1, 1.f);
    width_scale = pd.get(2, 1.f);
    output_height = pd.get(3, 0);
    output_width = pd.get(4, 0);
    dynamic_target_size = pd.get(5, 0);
    align_corner = pd.get(6, 0);

    if (resize_type < 0 || resize_type > 3)
    {
        NCNN_LOGE("unsupported resize type %d", resize_type);
        return -1;
    }

    if (dynamic_target_size == 1)
    {
        one_blob_only = false;
    }

    return 0;
}